

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O2

MPP_RET mpp_enc_proc_two_pass(Mpp *mpp,EncAsyncTaskInfo *task)

{
  HalEncTask *task_00;
  EncRcTaskInfo *__src;
  MppEnc pvVar1;
  ulong uVar2;
  EncImpl impl;
  void *hal;
  MppPacket s;
  RK_U32 RVar3;
  RK_S32 RVar4;
  RK_U32 RVar5;
  MPP_RET MVar6;
  size_t sVar7;
  char *fmt;
  undefined8 uVar8;
  int local_f0;
  EncRcTaskInfo rc_info;
  
  pvVar1 = mpp->mEnc;
  RVar4 = mpp_enc_refs_next_frm_is_intra(*(MppEncRefs *)((long)pvVar1 + 0x210));
  if (RVar4 == 0) {
    MVar6 = MPP_OK;
  }
  else {
    uVar2 = (task->rc).frm.val;
    __src = &(task->rc).info;
    memcpy(&rc_info,__src,0x88);
    impl = *(EncImpl *)((long)pvVar1 + 8);
    hal = *(void **)((long)pvVar1 + 0x10);
    s = (task->task).packet;
    RVar4 = (task->task).hw_length;
    RVar3 = (task->task).length;
    sVar7 = mpp_packet_get_length(s);
    if (((byte)mpp_enc_debug & 0x20) != 0) {
      _mpp_log_l(4,"mpp_enc","task %d two pass mode enter\n","mpp_enc_proc_two_pass",
                 (ulong)*(ushort *)((long)&(task->rc).frm + 6));
    }
    memcpy(__src,(void *)((long)pvVar1 + 0x240),0x88);
    RVar5 = mpp_packet_get_segment_nb((task->task).packet);
    (task->task).segment_nb = RVar5;
    if (((byte)mpp_enc_debug & 0x20) != 0) {
      _mpp_log_l(4,"mpp_enc","task %d enc proc dpb\n","mpp_enc_proc_two_pass",
                 (ulong)*(ushort *)((long)&(task->rc).frm + 6));
    }
    task_00 = &task->task;
    mpp_enc_refs_get_cpb_pass1(*(MppEncRefs *)((long)pvVar1 + 0x210),&(task->rc).cpb);
    if ((mpp_enc_debug._2_1_ & 1) != 0) {
      _mpp_log_l(4,"mpp_enc","frm %d start ***********************************\n",
                 "mpp_enc_proc_two_pass",(ulong)*(ushort *)((long)&(task->rc).cpb.curr + 6));
    }
    MVar6 = enc_impl_proc_dpb(impl,task_00);
    if (MVar6 == MPP_OK) {
      if (((byte)mpp_enc_debug & 0x20) != 0) {
        _mpp_log_l(4,"mpp_enc","task %d enc proc hal\n","mpp_enc_proc_two_pass",
                   (ulong)*(ushort *)((long)&(task->rc).frm + 6));
      }
      MVar6 = enc_impl_proc_hal(impl,task_00);
      if (MVar6 == MPP_OK) {
        if (((byte)mpp_enc_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_enc","task %d hal get task\n","mpp_enc_proc_two_pass",
                     (ulong)*(ushort *)((long)&(task->rc).frm + 6));
        }
        MVar6 = mpp_enc_hal_get_task(hal,task_00);
        if (MVar6 == MPP_OK) {
          if (((byte)mpp_enc_debug & 0x20) != 0) {
            _mpp_log_l(4,"mpp_enc","task %d hal generate reg\n","mpp_enc_proc_two_pass",
                       (ulong)*(ushort *)((long)&(task->rc).frm + 6));
          }
          MVar6 = mpp_enc_hal_gen_regs(hal,task_00);
          if (MVar6 == MPP_OK) {
            if (((byte)mpp_enc_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_enc","task %d hal start\n","mpp_enc_proc_two_pass",
                         (ulong)*(ushort *)((long)&(task->rc).frm + 6));
            }
            MVar6 = mpp_enc_hal_start(hal,task_00);
            if (MVar6 == MPP_OK) {
              if (((byte)mpp_enc_debug & 0x20) != 0) {
                _mpp_log_l(4,"mpp_enc","task %d hal wait\n","mpp_enc_proc_two_pass",
                           (ulong)*(ushort *)((long)&(task->rc).frm + 6));
              }
              MVar6 = mpp_enc_hal_wait(hal,task_00);
              if (MVar6 == MPP_OK) {
                if (((byte)mpp_enc_debug & 0x20) != 0) {
                  _mpp_log_l(4,"mpp_enc","task %d hal ret task\n","mpp_enc_proc_two_pass",
                             (ulong)*(ushort *)((long)&(task->rc).frm + 6));
                }
                MVar6 = mpp_enc_hal_ret_task(hal,task_00);
                if (MVar6 == MPP_OK) {
                  local_f0 = (int)sVar7;
                  mpp_packet_set_length(s,(long)local_f0);
                  mpp_packet_set_segment_nb(s,(task->task).segment_nb);
                  (task->task).hw_length = RVar4;
                  (task->task).length = RVar3;
                  (task->rc).frm.val = uVar2;
                  memcpy(__src,&rc_info,0x88);
                  if (((byte)mpp_enc_debug & 0x20) == 0) {
                    return MPP_OK;
                  }
                  _mpp_log_l(4,"mpp_enc","task %d two pass mode leave\n","mpp_enc_proc_two_pass",
                             uVar2 >> 0x30);
                  return MPP_OK;
                }
                fmt = "mpp %p mpp_enc_hal_ret_task:%-4d failed return %d";
                uVar8 = 0x654;
              }
              else {
                fmt = "mpp %p mpp_enc_hal_wait:%-4d failed return %d";
                uVar8 = 0x651;
              }
            }
            else {
              fmt = "mpp %p mpp_enc_hal_start:%-4d failed return %d";
              uVar8 = 0x64e;
            }
          }
          else {
            fmt = "mpp %p mpp_enc_hal_gen_regs:%-4d failed return %d";
            uVar8 = 0x64b;
          }
        }
        else {
          fmt = "mpp %p mpp_enc_hal_get_task:%-4d failed return %d";
          uVar8 = 0x648;
        }
      }
      else {
        fmt = "mpp %p enc_impl_proc_hal:%-4d failed return %d";
        uVar8 = 0x645;
      }
    }
    else {
      fmt = "mpp %p enc_impl_proc_dpb:%-4d failed return %d";
      uVar8 = 0x642;
    }
    _mpp_log_l(2,"mpp_enc",fmt,(char *)0x0,mpp,uVar8,MVar6);
  }
  return MVar6;
}

Assistant:

static MPP_RET mpp_enc_proc_two_pass(Mpp *mpp, EncAsyncTaskInfo *task)
{
    MppEncImpl *enc = (MppEncImpl *)mpp->mEnc;
    MPP_RET ret = MPP_OK;

    if (mpp_enc_refs_next_frm_is_intra(enc->refs)) {
        EncRcTask *rc_task = &task->rc;
        EncFrmStatus frm_bak = rc_task->frm;
        EncRcTaskInfo rc_info = rc_task->info;
        EncCpbStatus *cpb = &rc_task->cpb;
        EncFrmStatus *frm = &rc_task->frm;
        HalEncTask *hal_task = &task->task;
        EncImpl impl = enc->impl;
        MppEncHal hal = enc->enc_hal;
        MppPacket packet = hal_task->packet;
        RK_S32 task_len = hal_task->length;
        RK_S32 hw_len = hal_task->hw_length;
        RK_S32 pkt_len = mpp_packet_get_length(packet);

        enc_dbg_detail("task %d two pass mode enter\n", frm->seq_idx);
        rc_task->info = enc->rc_info_prev;
        hal_task->segment_nb = mpp_packet_get_segment_nb(hal_task->packet);

        enc_dbg_detail("task %d enc proc dpb\n", frm->seq_idx);
        mpp_enc_refs_get_cpb_pass1(enc->refs, cpb);

        enc_dbg_frm_status("frm %d start ***********************************\n", cpb->curr.seq_idx);
        ENC_RUN_FUNC2(enc_impl_proc_dpb, impl, hal_task, mpp, ret);

        enc_dbg_detail("task %d enc proc hal\n", frm->seq_idx);
        ENC_RUN_FUNC2(enc_impl_proc_hal, impl, hal_task, mpp, ret);

        enc_dbg_detail("task %d hal get task\n", frm->seq_idx);
        ENC_RUN_FUNC2(mpp_enc_hal_get_task, hal, hal_task, mpp, ret);

        enc_dbg_detail("task %d hal generate reg\n", frm->seq_idx);
        ENC_RUN_FUNC2(mpp_enc_hal_gen_regs, hal, hal_task, mpp, ret);

        enc_dbg_detail("task %d hal start\n", frm->seq_idx);
        ENC_RUN_FUNC2(mpp_enc_hal_start, hal, hal_task, mpp, ret);

        enc_dbg_detail("task %d hal wait\n", frm->seq_idx);
        ENC_RUN_FUNC2(mpp_enc_hal_wait,  hal, hal_task, mpp, ret);

        enc_dbg_detail("task %d hal ret task\n", frm->seq_idx);
        ENC_RUN_FUNC2(mpp_enc_hal_ret_task, hal, hal_task, mpp, ret);

        //recover status & packet
        mpp_packet_set_length(packet, pkt_len);
        mpp_packet_set_segment_nb(packet, hal_task->segment_nb);
        hal_task->hw_length = hw_len;
        hal_task->length = task_len;

        *frm = frm_bak;
        rc_task->info = rc_info;

        enc_dbg_detail("task %d two pass mode leave\n", frm->seq_idx);
    }
TASK_DONE:
    return ret;
}